

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSAOHDist_NECOF.cpp
# Opt level: O2

double __thiscall
FSAOHDist_NECOF::GetOHProb_relT
          (FSAOHDist_NECOF *this,Scope *agSc,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *ohI)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  const_reference pvVar4;
  const_reference this_00;
  const_reference pvVar5;
  ulong __n;
  double dVar6;
  
  dVar6 = 1.0;
  uVar3 = 0;
  while( true ) {
    __n = (ulong)uVar3;
    if ((ulong)((long)(agSc->super_SDT).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(agSc->super_SDT).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= __n) break;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&agSc->super_SDT,__n);
    uVar1 = *pvVar4;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(ohI,__n);
    uVar2 = *pvVar4;
    this_00 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::at(&this->_m_oHistMarginals,(ulong)uVar1);
    pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_00,(ulong)uVar2);
    dVar6 = dVar6 * *pvVar5;
    uVar3 = uVar3 + 1;
  }
  return dVar6;
}

Assistant:

double FSAOHDist_NECOF::GetOHProb_relT(
        const Scope& agSc, 
        const std::vector<Index>& ohI)
    const
{
    double p = 1.0;
    for(Index i=0; i < agSc.size(); i++)
    {
        Index agI = agSc.at(i);
        Index ohI_agI = ohI.at(i);
        double p_this_agent = _m_oHistMarginals.at(agI).at(ohI_agI);
        p *= p_this_agent;
    }
    return p;
}